

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::UpdateCTestConfiguration(cmCTest *this)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  pointer pPVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  mapped_type *this_00;
  ulong uVar8;
  allocator<char> local_f59;
  string local_f58;
  string local_f38;
  string_view local_f18;
  string local_f08 [32];
  undefined1 local_ee8 [8];
  ostringstream cmCTestLog_msg_3;
  unsigned_long local_d70;
  unsigned_long load;
  string local_d60;
  string local_d40;
  string *local_d20;
  string *testLoad;
  string local_d10;
  string local_cf0;
  int local_ccc;
  duration<long,_std::ratio<1L,_1L>_> local_cc8;
  rep_conflict local_cc0;
  Status local_cb4;
  allocator<char> local_ca9;
  string local_ca8;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  string local_c40;
  undefined1 local_c20 [8];
  string value;
  string key;
  size_type cpos;
  string local_bd0;
  string local_bb0;
  allocator<char> local_b89;
  string local_b88;
  undefined1 local_b68 [8];
  string line;
  char buffer [1024];
  long local_740;
  ifstream fin;
  string local_538 [32];
  undefined1 local_518 [8];
  ostringstream cmCTestLog_msg_2;
  string local_398 [32];
  undefined1 local_378 [8];
  ostringstream cmCTestLog_msg_1;
  string local_200 [32];
  undefined1 local_1e0 [8];
  ostringstream cmCTestLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  string fileName;
  cmCTest *this_local;
  
  fileName.field_2._8_8_ = this;
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  if ((pPVar4->SuppressUpdatingCTestConfiguration & 1U) != 0) {
    this_local._7_1_ = 1;
    goto LAB_00166955;
  }
  pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &pPVar4->BinaryDir,"/CTestConfiguration.ini");
  bVar1 = cmsys::SystemTools::FileExists
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  if (!bVar1) {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    std::operator+(&local_68,&pPVar4->BinaryDir,"/DartConfiguration.tcl");
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
  poVar5 = std::operator<<((ostream *)local_1e0,"UpdateCTestConfiguration  from :");
  poVar5 = std::operator<<(poVar5,(string *)local_38);
  std::operator<<(poVar5,"\n");
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x2c2,pcVar6,false);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_38);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
    poVar5 = std::operator<<((ostream *)local_518,"Parse Config file:");
    poVar5 = std::operator<<(poVar5,(string *)local_38);
    std::operator<<(poVar5,"\n");
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x2cb,pcVar6,false);
    std::__cxx11::string::~string(local_538);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_740,pcVar6,_S_in);
    bVar3 = std::ios::operator!((ios *)((long)&local_740 + *(long *)(local_740 + -0x18)));
    if ((bVar3 & 1) == 0) {
      while (bVar1 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&local_740 + *(long *)(local_740 + -0x18))), bVar1) {
        line.field_2._M_local_buf[8] = '\0';
        std::istream::getline((char *)&local_740,(long)((long)&line.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b88,line.field_2._M_local_buf + 8,&local_b89);
        CleanString((string *)local_b68,&local_b88,0);
        std::__cxx11::string::~string((string *)&local_b88);
        std::allocator<char>::~allocator(&local_b89);
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          while( true ) {
            bVar2 = std::ios::operator_cast_to_bool
                              ((ios *)((long)&local_740 + *(long *)(local_740 + -0x18)));
            bVar1 = false;
            if (bVar2) {
              pcVar6 = (char *)std::__cxx11::string::back();
              bVar1 = *pcVar6 == '\\';
            }
            if (!bVar1) break;
            std::__cxx11::string::size();
            std::__cxx11::string::resize((ulong)local_b68);
            line.field_2._M_local_buf[8] = '\0';
            std::istream::getline((char *)&local_740,(long)((long)&line.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_bd0,line.field_2._M_local_buf + 8,
                       (allocator<char> *)((long)&cpos + 7));
            CleanString(&local_bb0,&local_bd0,0);
            std::__cxx11::string::operator+=((string *)local_b68,(string *)&local_bb0);
            std::__cxx11::string::~string((string *)&local_bb0);
            std::__cxx11::string::~string((string *)&local_bd0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&cpos + 7));
          }
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_b68);
          if ((*pcVar6 != '#') &&
             (lVar7 = std::__cxx11::string::find_first_of((char)local_b68,0x3a), lVar7 != -1)) {
            std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)local_b68);
            CleanString((string *)local_c20,(string *)local_b68,lVar7 + 1);
            pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                     operator->(&this->Impl);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&pPVar4->CTestConfiguration,
                                   (key_type *)((long)&value.field_2 + 8));
            std::__cxx11::string::operator=((string *)this_00,(string *)local_c20);
            std::__cxx11::string::~string((string *)local_c20);
            std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
          }
        }
        std::__cxx11::string::~string((string *)local_b68);
      }
      std::ifstream::close();
      bVar1 = false;
    }
    else {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::ifstream::~ifstream(&local_740);
    if (!bVar1) goto LAB_001662ff;
  }
  else {
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    if ((pPVar4->ProduceXML & 1U) == 0) {
LAB_001662ff:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c60,"BuildDirectory",&local_c61);
      GetCTestConfiguration(&local_c40,this,&local_c60);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_c40);
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::~allocator(&local_c61);
      if (((bVar3 ^ 0xff) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ca8,"BuildDirectory",&local_ca9);
        GetCTestConfiguration(&local_c88,this,&local_ca8);
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        std::__cxx11::string::operator=((string *)&pPVar4->BinaryDir,(string *)&local_c88);
        std::__cxx11::string::~string((string *)&local_c88);
        std::__cxx11::string::~string((string *)&local_ca8);
        std::allocator<char>::~allocator(&local_ca9);
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        local_cb4 = cmsys::SystemTools::ChangeDirectory(&pPVar4->BinaryDir);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d10,"TimeOut",(allocator<char> *)((long)&testLoad + 7));
      GetCTestConfiguration(&local_cf0,this,&local_d10);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_ccc = atoi(pcVar6);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1l>> *)&local_cc8,&local_ccc);
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_cc0,&local_cc8);
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      (pPVar4->TimeOut).__r = local_cc0;
      std::__cxx11::string::~string((string *)&local_cf0);
      std::__cxx11::string::~string((string *)&local_d10);
      std::allocator<char>::~allocator((allocator<char> *)((long)&testLoad + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d60,"TestLoad",(allocator<char> *)((long)&load + 7));
      GetCTestConfiguration(&local_d40,this,&local_d60);
      std::__cxx11::string::~string((string *)&local_d60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&load + 7));
      local_d20 = &local_d40;
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        bVar1 = cmStrToULong(local_d20,&local_d70);
        if (bVar1) {
          SetTestLoad(this,local_d70);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ee8);
          poVar5 = std::operator<<((ostream *)local_ee8,"Invalid value for \'Test Load\' : ");
          poVar5 = std::operator<<(poVar5,(string *)local_d20);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x2fd,pcVar6,false);
          std::__cxx11::string::~string(local_f08);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ee8);
        }
      }
      pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                         (&this->Impl);
      if ((pPVar4->ProduceXML & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f58,"CompressSubmission",&local_f59);
        GetCTestConfiguration(&local_f38,this,&local_f58);
        local_f18 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f38);
        bVar1 = cmIsOn(local_f18);
        pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                 operator->(&this->Impl);
        pPVar4->CompressXMLFiles = bVar1;
        std::__cxx11::string::~string((string *)&local_f38);
        std::__cxx11::string::~string((string *)&local_f58);
        std::allocator<char>::~allocator(&local_f59);
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)&local_d40);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
      poVar5 = std::operator<<((ostream *)local_378,"Cannot find file: ");
      poVar5 = std::operator<<(poVar5,(string *)local_38);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x2c6,pcVar6,false);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
      this_local._7_1_ = 0;
    }
  }
  std::__cxx11::string::~string((string *)local_38);
LAB_00166955:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTest::UpdateCTestConfiguration()
{
  if (this->Impl->SuppressUpdatingCTestConfiguration) {
    return true;
  }
  std::string fileName = this->Impl->BinaryDir + "/CTestConfiguration.ini";
  if (!cmSystemTools::FileExists(fileName)) {
    fileName = this->Impl->BinaryDir + "/DartConfiguration.tcl";
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "UpdateCTestConfiguration  from :" << fileName << "\n");
  if (!cmSystemTools::FileExists(fileName)) {
    // No need to exit if we are not producing XML
    if (this->Impl->ProduceXML) {
      cmCTestLog(this, WARNING, "Cannot find file: " << fileName << std::endl);
      return false;
    }
  } else {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Parse Config file:" << fileName << "\n");
    // parse the dart test file
    cmsys::ifstream fin(fileName.c_str());

    if (!fin) {
      return false;
    }

    char buffer[1024];
    while (fin) {
      buffer[0] = 0;
      fin.getline(buffer, 1023);
      buffer[1023] = 0;
      std::string line = cmCTest::CleanString(buffer);
      if (line.empty()) {
        continue;
      }
      while (fin && (line.back() == '\\')) {
        line.resize(line.size() - 1);
        buffer[0] = 0;
        fin.getline(buffer, 1023);
        buffer[1023] = 0;
        line += cmCTest::CleanString(buffer);
      }
      if (line[0] == '#') {
        continue;
      }
      std::string::size_type cpos = line.find_first_of(':');
      if (cpos == std::string::npos) {
        continue;
      }
      std::string key = line.substr(0, cpos);
      std::string value = cmCTest::CleanString(line, cpos + 1);
      this->Impl->CTestConfiguration[key] = value;
    }
    fin.close();
  }
  if (!this->GetCTestConfiguration("BuildDirectory").empty()) {
    this->Impl->BinaryDir = this->GetCTestConfiguration("BuildDirectory");
    cmSystemTools::ChangeDirectory(this->Impl->BinaryDir);
  }
  this->Impl->TimeOut =
    std::chrono::seconds(atoi(this->GetCTestConfiguration("TimeOut").c_str()));
  std::string const& testLoad = this->GetCTestConfiguration("TestLoad");
  if (!testLoad.empty()) {
    unsigned long load;
    if (cmStrToULong(testLoad, &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << testLoad << std::endl);
    }
  }
  if (this->Impl->ProduceXML) {
    this->Impl->CompressXMLFiles =
      cmIsOn(this->GetCTestConfiguration("CompressSubmission"));
  }
  return true;
}